

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_short,_12,_true>_>::
~UpdateSuccessForZeroNoiseAllFlat
          (UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_short,_12,_true>_> *this)

{
  void *in_RDI;
  
  ~UpdateSuccessForZeroNoiseAllFlat
            ((UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_short,_12,_true>_> *)0x5c6ee8
            );
  operator_delete(in_RDI);
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateSuccessForZeroNoiseAllFlat) {
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  this->denoised_.assign(this->denoised_.size(), 128);
  this->data_.assign(this->denoised_.size(), 128);
  EXPECT_EQ(AOM_NOISE_STATUS_INTERNAL_ERROR, this->NoiseModelUpdate());
}